

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O1

void __thiscall
soul::HTMLGenerator::printLibrary(HTMLGenerator *this,HTMLElement *parent,File *library)

{
  pointer pMVar1;
  HTMLElement *pHVar2;
  HTMLElement *pHVar3;
  undefined1 in_R9B;
  Module *m;
  pointer m_00;
  string_view value;
  string_view value_00;
  string_view text;
  string_view value_01;
  string_view source;
  char local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  pHVar2 = choc::html::HTMLElement::addDiv(parent);
  value._M_str = "library";
  value._M_len = 7;
  pHVar2 = choc::html::HTMLElement::setClass(pHVar2,value);
  value_00._M_str = (library->UID)._M_dataplus._M_p;
  value_00._M_len = (library->UID)._M_string_length;
  pHVar2 = choc::html::HTMLElement::setID(pHVar2,value_00);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"h1","");
  std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
  emplace_back<std::__cxx11::string>
            ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
             &pHVar2->children,&local_60);
  text._M_str = (library->title)._M_dataplus._M_p;
  text._M_len = (library->title)._M_string_length;
  choc::html::HTMLElement::addContent
            ((pHVar2->children).
             super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1,text);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((library->summary)._M_string_length != 0) {
    pHVar3 = choc::html::HTMLElement::addDiv(pHVar2);
    value_01._M_str = "summary";
    value_01._M_len = 7;
    pHVar3 = choc::html::HTMLElement::setClass(pHVar3,value_01);
    local_61 = '\n';
    source._M_str = &local_61;
    source._M_len = (size_t)(library->summary)._M_dataplus._M_p;
    choc::text::
    splitString<choc::text::splitString[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,char,bool)::_lambda(char)_1_>
              (&local_40,(text *)(library->summary)._M_string_length,source,
               (anon_class_1_1_b77187a0 *)0x0,(bool)in_R9B);
    addMarkdownAsHTML(pHVar3,&local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
  }
  pMVar1 = (library->modules).
           super__Vector_base<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (m_00 = (library->modules).
              super__Vector_base<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>
              ._M_impl.super__Vector_impl_data._M_start; m_00 != pMVar1; m_00 = m_00 + 1) {
    printModule(this,pHVar2,m_00);
  }
  return;
}

Assistant:

void printLibrary (choc::html::HTMLElement& parent, const SourceCodeModel::File& library)
    {
        auto& libraryDiv = parent.addDiv ("library").setID (library.UID);

        libraryDiv.addChild ("h1").addContent (library.title);

        if (! library.summary.empty())
            addMarkdownAsHTML (libraryDiv.addDiv ("summary"),
                               choc::text::splitIntoLines (library.summary, false));

        for (auto& m : library.modules)
            printModule (libraryDiv, m);
    }